

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O0

void modified_public_keycase::test_method<picnic_params_t_const&>(anon_enum_32 *parameters)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *this_00;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *pbVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  modified_public_keycase t;
  context_frame context_frame_1970;
  lazy_ostream *in_stack_fffffffffffff588;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff590;
  std_string *in_stack_fffffffffffff598;
  basic_cstring<const_char> *in_stack_fffffffffffff5a0;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff5b0;
  const_string *in_stack_fffffffffffff5c8;
  size_t in_stack_fffffffffffff5d0;
  const_string *in_stack_fffffffffffff5d8;
  basic_wrap_stringstream<char> *file;
  unit_test_log_t *in_stack_fffffffffffff5e0;
  undefined1 local_988 [64];
  undefined1 local_948 [64];
  undefined1 local_908 [64];
  undefined1 local_8c8 [64];
  undefined1 local_888 [64];
  undefined1 auStack_848 [24];
  undefined1 local_830 [40];
  undefined1 auStack_808 [24];
  basic_cstring<const_char> local_7e0;
  undefined1 local_7c9;
  undefined1 local_7c8 [64];
  undefined1 local_788 [64];
  undefined1 in_stack_fffffffffffff8b8 [64];
  undefined1 auVar5 [16];
  basic_cstring<const_char> local_620;
  undefined1 local_609;
  undefined1 local_608 [64];
  undefined1 local_5c8 [64];
  undefined1 local_588 [64];
  undefined1 local_548 [64];
  undefined1 local_508 [64];
  undefined1 auStack_4c8 [24];
  undefined1 local_4b0 [40];
  undefined1 auStack_488 [24];
  basic_cstring<const_char> local_460;
  undefined1 local_449;
  undefined1 local_448 [64];
  undefined1 local_408 [64];
  undefined1 local_3c8 [64];
  undefined1 local_388 [64];
  undefined1 local_348 [64];
  undefined1 auStack_308 [24];
  undefined1 local_2f0 [40];
  undefined1 auStack_2c8 [24];
  basic_cstring<const_char> local_2a0;
  undefined1 local_289;
  undefined1 local_288 [64];
  undefined1 local_248 [64];
  undefined1 local_208 [64];
  undefined1 local_1c8 [64];
  undefined1 local_188 [64];
  undefined1 auStack_148 [24];
  undefined1 local_130 [40];
  undefined1 auStack_108 [24];
  basic_cstring<const_char> local_d8;
  anon_enum_32 *local_c8;
  context_frame local_c [3];
  
  auVar5 = in_stack_fffffffffffff8b8._48_16_;
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffff598,(char (*) [1])in_stack_fffffffffffff590);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
             in_stack_fffffffffffff598,(char (*) [11])in_stack_fffffffffffff590);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>
              *)in_stack_fffffffffffff598,(char (*) [4])in_stack_fffffffffffff590);
  local_c8 = (anon_enum_32 *)
             boost::test_tools::tt_detail::print_helper<picnic_params_t>
                       ((anon_enum_32 *)in_stack_fffffffffffff588);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>
              *)in_stack_fffffffffffff598,
             (print_helper_t<picnic_params_t> *)in_stack_fffffffffffff590);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
              *)in_stack_fffffffffffff598,(char (*) [3])in_stack_fffffffffffff590);
  boost::test_tools::tt_detail::context_frame::context_frame
            ((context_frame *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>,_char[3],_const_char_(&)[3]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>,_char[3],_const_char_(&)[3]>
              *)0x1d1947);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
              *)0x1d1954);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>
              *)0x1d1961);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>
              *)0x1d196e);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
  ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                      *)0x1d197b);
  bVar1 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(local_c);
  if (bVar1) {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar4 = vmovdqu64_avx512f(auVar3);
    auStack_108 = auVar4._40_24_;
    auVar4 = vmovdqu64_avx512f(auVar3);
    auStack_148 = auVar4._0_24_;
    local_130 = auVar4._24_40_;
    local_188 = vmovdqu64_avx512f(auVar3);
    local_1c8 = vmovdqu64_avx512f(auVar3);
    local_208 = vmovdqu64_avx512f(auVar3);
    local_248 = vmovdqu64_avx512f(auVar3);
    local_288 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_288);
    local_289 = 0x22;
    boost::operator<<(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [20])in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [15])in_stack_fffffffffffff588);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar4 = vmovdqu64_avx512f(auVar3);
    auStack_2c8 = auVar4._40_24_;
    auVar4 = vmovdqu64_avx512f(auVar3);
    auStack_308 = auVar4._0_24_;
    local_2f0 = auVar4._24_40_;
    local_348 = vmovdqu64_avx512f(auVar3);
    local_388 = vmovdqu64_avx512f(auVar3);
    local_3c8 = vmovdqu64_avx512f(auVar3);
    local_408 = vmovdqu64_avx512f(auVar3);
    local_448 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_448);
    local_449 = 0x22;
    boost::operator<<(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [20])in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [16])in_stack_fffffffffffff588);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::unit_test::setup_conditional<modified_public_keycase>
              ((modified_public_keycase *)in_stack_fffffffffffff590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar4 = vmovdqu64_avx512f(auVar3);
    auStack_488 = auVar4._40_24_;
    auVar4 = vmovdqu64_avx512f(auVar3);
    auStack_4c8 = auVar4._0_24_;
    local_4b0 = auVar4._24_40_;
    local_508 = vmovdqu64_avx512f(auVar3);
    local_548 = vmovdqu64_avx512f(auVar3);
    local_588 = vmovdqu64_avx512f(auVar3);
    local_5c8 = vmovdqu64_avx512f(auVar3);
    local_608 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_608);
    local_609 = 0x22;
    boost::operator<<(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [20])in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [13])in_stack_fffffffffffff588);
    this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff590);
    _impl<picnic_params_t>(auVar5._8_8_,auVar5._0_8_);
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_620,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar4 = ZEXT1664((undefined1  [16])0x0);
    vmovdqu64_avx512f(auVar4);
    vmovdqu64_avx512f(auVar4);
    vmovdqu64_avx512f(auVar4);
    vmovdqu64_avx512f(auVar4);
    vmovdqu64_avx512f(auVar4);
    local_788 = vmovdqu64_avx512f(auVar4);
    local_7c8 = vmovdqu64_avx512f(auVar4);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_7c8);
    local_7c9 = 0x22;
    line_num = boost::operator<<(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
    msg = boost::operator<<(in_stack_fffffffffffff590,(char (*) [20])in_stack_fffffffffffff588);
    boost::operator<<(in_stack_fffffffffffff590,(char (*) [19])in_stack_fffffffffffff588);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::unit_test::teardown_conditional<modified_public_keycase>
              ((modified_public_keycase *)in_stack_fffffffffffff590);
    pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar4 = vmovdqu64_avx512f(auVar3);
    auStack_808 = auVar4._40_24_;
    auVar4 = vmovdqu64_avx512f(auVar3);
    auStack_848 = auVar4._0_24_;
    local_830 = auVar4._24_40_;
    local_888 = vmovdqu64_avx512f(auVar3);
    local_8c8 = vmovdqu64_avx512f(auVar3);
    local_908 = vmovdqu64_avx512f(auVar3);
    local_948 = vmovdqu64_avx512f(auVar3);
    local_988 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff590);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_988);
    boost::operator<<(in_stack_fffffffffffff590,(char *)in_stack_fffffffffffff588);
    this_00 = boost::operator<<(in_stack_fffffffffffff590,(char (*) [20])in_stack_fffffffffffff588);
    s = boost::operator<<(in_stack_fffffffffffff590,(char (*) [15])in_stack_fffffffffffff588);
    pbVar2 = (basic_wrap_stringstream<char> *)
             boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)this_00,(std_string *)s);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,(const_string *)file,(size_t)line_num,(const_string *)msg);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(pbVar2);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame((context_frame *)0x1d21c1);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(modified_public_key, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    signature.resize(max_signature_size);

    const size_t message_size = message_inc;
    message.resize(message_size);
    // fill message with some data
    randomize_container(message);

    for (size_t offset = 1; offset != 15; ++offset) {
      sk.data[picnic_get_private_key_size(parameters) - offset] ^= 0xff;
    }

    size_t signature_len = max_signature_size;
    BOOST_TEST(picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
  }
}